

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O2

void multikey_cache<8u,true>(Cacheblock<8U>_conflict *cache,size_t N,size_t depth)

{
  byte *pbVar1;
  uint64_t uVar2;
  uchar *puVar3;
  uchar *puVar4;
  size_t i;
  ulong uVar5;
  Cacheblock<8U>_conflict *pCVar6;
  Cacheblock<8U>_conflict *pCVar7;
  Cacheblock<8U>_conflict *pCVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
LAB_001b782d:
  if (N < 0x20) {
    if (N == 0) {
      return;
    }
    insertion_sort<8u>(cache,(int)N,depth);
    return;
  }
  uVar5 = 0;
  do {
    if (uVar5 == N) {
      uVar11 = N >> 3;
      pCVar6 = med3char<Cacheblock<8u>,Cmp>(cache,cache + uVar11,cache + (N >> 2));
      pCVar7 = med3char<Cacheblock<8u>,Cmp>
                         (cache + ((N >> 1) - uVar11),cache + (N >> 1),cache + (N >> 1) + uVar11);
      uVar5 = N - 1;
      pCVar8 = med3char<Cacheblock<8u>,Cmp>
                         (cache + (uVar5 - (N >> 2)),cache + (uVar5 - uVar11),cache + (N - 3));
      pCVar6 = med3char<Cacheblock<8u>,Cmp>(pCVar6,pCVar7,pCVar8);
      uVar2 = cache->cached_bytes;
      puVar3 = cache->ptr;
      puVar4 = pCVar6->ptr;
      cache->cached_bytes = pCVar6->cached_bytes;
      cache->ptr = puVar4;
      pCVar6->cached_bytes = uVar2;
      pCVar6->ptr = puVar3;
      uVar11 = cache->cached_bytes;
      uVar12 = 1;
      uVar9 = uVar5;
      uVar14 = uVar12;
      uVar16 = uVar5;
      do {
        for (pCVar6 = cache + uVar12;
            (uVar12 <= uVar9 && (uVar17 = pCVar6->cached_bytes, uVar11 > uVar17 || uVar17 == uVar11)
            ); pCVar6 = pCVar6 + 1) {
          uVar15 = uVar14;
          if (uVar11 <= uVar17) {
            uVar15 = uVar14 + 1;
            uVar2 = cache[uVar14].cached_bytes;
            puVar3 = cache[uVar14].ptr;
            puVar4 = pCVar6->ptr;
            cache[uVar14].cached_bytes = pCVar6->cached_bytes;
            cache[uVar14].ptr = puVar4;
            pCVar6->cached_bytes = uVar2;
            pCVar6->ptr = puVar3;
          }
          uVar12 = uVar12 + 1;
          uVar14 = uVar15;
        }
        pCVar7 = cache + uVar9;
        while( true ) {
          if (uVar9 < uVar12) {
            uVar5 = uVar5 - uVar16;
            sVar13 = uVar16 - uVar9;
            uVar12 = uVar12 - uVar14;
            uVar9 = uVar14;
            if (uVar12 < uVar14) {
              uVar9 = uVar12;
            }
            std::swap_ranges<Cacheblock<8u>*,Cacheblock<8u>*>(cache,cache + uVar9,pCVar6 + -uVar9);
            uVar9 = uVar5;
            if (sVar13 < uVar5) {
              uVar9 = sVar13;
            }
            std::swap_ranges<Cacheblock<8u>*,Cacheblock<8u>*>
                      (pCVar6,pCVar6 + uVar9,cache + (N - uVar9));
            multikey_cache<8u,false>(cache,uVar12,depth);
            multikey_cache<8u,false>(pCVar6 + ((N - 1) - uVar16),sVar13,depth);
            if ((char)uVar11 == '\0') {
              return;
            }
            N = uVar5 + uVar14;
            cache = pCVar6 + -uVar14;
            depth = depth + 8;
            goto LAB_001b782d;
          }
          if (pCVar7->cached_bytes < uVar11) break;
          uVar17 = uVar16;
          if (pCVar7->cached_bytes == uVar11) {
            uVar17 = uVar16 - 1;
            uVar2 = cache[uVar16].cached_bytes;
            puVar3 = cache[uVar16].ptr;
            puVar4 = pCVar7->ptr;
            cache[uVar16].cached_bytes = pCVar7->cached_bytes;
            cache[uVar16].ptr = puVar4;
            pCVar7->cached_bytes = uVar2;
            pCVar7->ptr = puVar3;
          }
          uVar9 = uVar9 - 1;
          pCVar7 = pCVar7 + -1;
          uVar16 = uVar17;
        }
        uVar2 = pCVar6->cached_bytes;
        puVar3 = pCVar6->ptr;
        puVar4 = pCVar7->ptr;
        pCVar6->cached_bytes = pCVar7->cached_bytes;
        pCVar6->ptr = puVar4;
        pCVar7->cached_bytes = uVar2;
        pCVar7->ptr = puVar3;
        uVar12 = uVar12 + 1;
        uVar9 = uVar9 - 1;
      } while( true );
    }
    uVar11 = 0;
    lVar10 = 0x40;
    sVar13 = depth;
    do {
      if (lVar10 == 0) break;
      pbVar1 = cache[uVar5].ptr + sVar13;
      lVar10 = lVar10 + -8;
      uVar11 = uVar11 | (ulong)*pbVar1 << ((byte)lVar10 & 0x3f);
      sVar13 = sVar13 + 1;
    } while ((ulong)*pbVar1 != 0);
    cache[uVar5].cached_bytes = uVar11;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}